

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

void embree::avx::SphereMiIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *sphere)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Scene *pSVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  uint uVar15;
  uint uVar16;
  undefined4 uVar17;
  RTCIntersectArguments *pRVar18;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  SphereIntersectorHitM<4> hit;
  int local_1bc;
  undefined1 local_1b8 [16];
  RTCFilterFunctionNArguments local_1a8;
  float local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined8 local_16c;
  uint local_164;
  uint local_160;
  uint local_15c;
  uint local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  ulong uVar19;
  undefined1 auVar43 [64];
  
  pSVar9 = context->scene;
  pGVar10 = (pSVar9->geometries).items[sphere->sharedGeomID].ptr;
  lVar20 = *(long *)&pGVar10->field_0x58;
  _Var11 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar23 = *(undefined1 (*) [16])(lVar20 + (sphere->primIDs).field_0.i[0] * _Var11);
  auVar26 = *(undefined1 (*) [16])(lVar20 + (sphere->primIDs).field_0.i[1] * _Var11);
  auVar49 = *(undefined1 (*) [16])(lVar20 + (sphere->primIDs).field_0.i[2] * _Var11);
  auVar32 = *(undefined1 (*) [16])(lVar20 + (sphere->primIDs).field_0.i[3] * _Var11);
  auVar33 = vunpcklps_avx(auVar23,auVar49);
  auVar49 = vunpckhps_avx(auVar23,auVar49);
  auVar23 = vunpcklps_avx(auVar26,auVar32);
  auVar32 = vunpckhps_avx(auVar26,auVar32);
  auVar44 = vunpcklps_avx(auVar33,auVar23);
  auVar33 = vunpckhps_avx(auVar33,auVar23);
  auVar28 = vunpcklps_avx(auVar49,auVar32);
  auVar23 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar26 = vpcmpgtd_avx(auVar23,_DAT_01f4ad30);
  local_48 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  aVar5 = (ray->super_RayK<1>).dir.field_0;
  auVar23 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
  auVar24 = vunpckhps_avx(auVar49,auVar32);
  auVar49 = vrcpss_avx(auVar23,auVar23);
  auVar23 = ZEXT416((uint)(auVar49._0_4_ * (2.0 - auVar23._0_4_ * auVar49._0_4_)));
  auVar49 = vshufps_avx(auVar23,auVar23,0);
  uVar17 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar23._4_4_ = uVar17;
  auVar23._0_4_ = uVar17;
  auVar23._8_4_ = uVar17;
  auVar23._12_4_ = uVar17;
  auVar23 = vsubps_avx(auVar44,auVar23);
  uVar17 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar32._4_4_ = uVar17;
  auVar32._0_4_ = uVar17;
  auVar32._8_4_ = uVar17;
  auVar32._12_4_ = uVar17;
  auVar32 = vsubps_avx(auVar33,auVar32);
  uVar17 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar33._4_4_ = uVar17;
  auVar33._0_4_ = uVar17;
  auVar33._8_4_ = uVar17;
  auVar33._12_4_ = uVar17;
  auVar33 = vsubps_avx(auVar28,auVar33);
  fVar1 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar51 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar52 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar53 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
  auVar34._0_4_ =
       auVar49._0_4_ * (fVar1 * auVar23._0_4_ + fVar2 * auVar32._0_4_ + fVar3 * auVar33._0_4_);
  auVar34._4_4_ =
       auVar49._4_4_ * (fVar1 * auVar23._4_4_ + fVar2 * auVar32._4_4_ + fVar3 * auVar33._4_4_);
  auVar34._8_4_ =
       auVar49._8_4_ * (fVar1 * auVar23._8_4_ + fVar2 * auVar32._8_4_ + fVar3 * auVar33._8_4_);
  auVar34._12_4_ =
       auVar49._12_4_ * (fVar1 * auVar23._12_4_ + fVar2 * auVar32._12_4_ + fVar3 * auVar33._12_4_);
  auVar44._0_4_ = fVar1 * auVar34._0_4_;
  auVar44._4_4_ = fVar1 * auVar34._4_4_;
  auVar44._8_4_ = fVar1 * auVar34._8_4_;
  auVar44._12_4_ = fVar1 * auVar34._12_4_;
  auVar46._0_4_ = fVar2 * auVar34._0_4_;
  auVar46._4_4_ = fVar2 * auVar34._4_4_;
  auVar46._8_4_ = fVar2 * auVar34._8_4_;
  auVar46._12_4_ = fVar2 * auVar34._12_4_;
  auVar48._0_4_ = fVar3 * auVar34._0_4_;
  auVar48._4_4_ = fVar3 * auVar34._4_4_;
  auVar48._8_4_ = fVar3 * auVar34._8_4_;
  auVar48._12_4_ = fVar3 * auVar34._12_4_;
  auVar44 = vsubps_avx(auVar23,auVar44);
  auVar45 = ZEXT1664(auVar44);
  auVar32 = vsubps_avx(auVar32,auVar46);
  auVar47 = ZEXT1664(auVar32);
  auVar33 = vsubps_avx(auVar33,auVar48);
  auVar50 = ZEXT1664(auVar33);
  auVar38._0_4_ =
       auVar44._0_4_ * auVar44._0_4_ + auVar32._0_4_ * auVar32._0_4_ + auVar33._0_4_ * auVar33._0_4_
  ;
  auVar38._4_4_ =
       auVar44._4_4_ * auVar44._4_4_ + auVar32._4_4_ * auVar32._4_4_ + auVar33._4_4_ * auVar33._4_4_
  ;
  auVar38._8_4_ =
       auVar44._8_4_ * auVar44._8_4_ + auVar32._8_4_ * auVar32._8_4_ + auVar33._8_4_ * auVar33._8_4_
  ;
  auVar38._12_4_ =
       auVar44._12_4_ * auVar44._12_4_ +
       auVar32._12_4_ * auVar32._12_4_ + auVar33._12_4_ * auVar33._12_4_;
  auVar28._0_4_ = auVar24._0_4_ * auVar24._0_4_;
  auVar28._4_4_ = auVar24._4_4_ * auVar24._4_4_;
  auVar28._8_4_ = auVar24._8_4_ * auVar24._8_4_;
  auVar28._12_4_ = auVar24._12_4_ * auVar24._12_4_;
  auVar23 = vcmpps_avx(auVar38,auVar28,2);
  auVar24 = auVar26 & auVar23;
  if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar24[0xf] < '\0') {
    auVar23 = vandps_avx(auVar23,auVar26);
    auVar26 = vsubps_avx(auVar28,auVar38);
    auVar24._0_4_ = auVar49._0_4_ * auVar26._0_4_;
    auVar24._4_4_ = auVar49._4_4_ * auVar26._4_4_;
    auVar24._8_4_ = auVar49._8_4_ * auVar26._8_4_;
    auVar24._12_4_ = auVar49._12_4_ * auVar26._12_4_;
    auVar28 = vsqrtps_avx(auVar24);
    auVar54 = ZEXT1664(auVar28);
    auVar38 = vsubps_avx(auVar34,auVar28);
    auVar42._0_4_ = auVar28._0_4_ + auVar34._0_4_;
    auVar42._4_4_ = auVar28._4_4_ + auVar34._4_4_;
    auVar42._8_4_ = auVar28._8_4_ + auVar34._8_4_;
    auVar42._12_4_ = auVar28._12_4_ + auVar34._12_4_;
    auVar43 = ZEXT1664(auVar42);
    uVar17 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    auVar35._4_4_ = uVar17;
    auVar35._0_4_ = uVar17;
    auVar35._8_4_ = uVar17;
    auVar35._12_4_ = uVar17;
    auVar26 = vcmpps_avx(auVar35,auVar38,2);
    fVar4 = (ray->super_RayK<1>).tfar;
    auVar39._4_4_ = fVar4;
    auVar39._0_4_ = fVar4;
    auVar39._8_4_ = fVar4;
    auVar39._12_4_ = fVar4;
    auVar49 = vcmpps_avx(auVar38,auVar39,2);
    auVar26 = vandps_avx(auVar49,auVar26);
    auVar55 = ZEXT1664(auVar26);
    auVar26 = vandps_avx(auVar26,auVar23);
    auVar49 = vcmpps_avx(auVar35,auVar42,2);
    auVar24 = vcmpps_avx(auVar42,auVar39,2);
    auVar49 = vandps_avx(auVar49,auVar24);
    auVar23 = vandps_avx(auVar49,auVar23);
    auVar56 = ZEXT1664(auVar23);
    local_1b8 = vorps_avx(auVar23,auVar26);
    if ((((local_1b8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (local_1b8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_1b8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        local_1b8[0xf] < '\0') {
      auVar49._0_4_ = (ray->super_RayK<1>).tfar;
      auVar49._4_4_ = (ray->super_RayK<1>).mask;
      auVar49._8_4_ = (ray->super_RayK<1>).id;
      auVar49._12_4_ = (ray->super_RayK<1>).flags;
      auVar41 = ZEXT1664(auVar49);
      local_148 = vblendvps_avx(auVar42,auVar38,auVar26);
      auVar25._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
      auVar25._8_4_ = -auVar28._8_4_;
      auVar25._12_4_ = -auVar28._12_4_;
      auVar23 = vblendvps_avx(auVar28,auVar25,auVar26);
      fVar4 = auVar23._0_4_;
      auVar29._0_4_ = fVar1 * fVar4;
      fVar12 = auVar23._4_4_;
      auVar29._4_4_ = fVar1 * fVar12;
      fVar13 = auVar23._8_4_;
      auVar29._8_4_ = fVar1 * fVar13;
      fVar14 = auVar23._12_4_;
      auVar29._12_4_ = fVar1 * fVar14;
      auVar36._0_4_ = fVar2 * fVar4;
      auVar36._4_4_ = fVar2 * fVar12;
      auVar36._8_4_ = fVar2 * fVar13;
      auVar36._12_4_ = fVar2 * fVar14;
      auVar26._0_4_ = fVar3 * fVar4;
      auVar26._4_4_ = fVar3 * fVar12;
      auVar26._8_4_ = fVar3 * fVar13;
      auVar26._12_4_ = fVar3 * fVar14;
      local_138 = vsubps_avx(auVar29,auVar44);
      local_128 = vsubps_avx(auVar36,auVar32);
      local_118 = vsubps_avx(auVar26,auVar33);
      auVar30._8_4_ = 0x7f800000;
      auVar30._0_8_ = 0x7f8000007f800000;
      auVar30._12_4_ = 0x7f800000;
      local_58 = local_148;
      auVar23 = vblendvps_avx(auVar30,local_148,local_1b8);
      auVar40 = ZEXT1664(auVar30);
      auVar26 = vshufps_avx(auVar23,auVar23,0xb1);
      auVar26 = vminps_avx(auVar26,auVar23);
      auVar32 = vshufpd_avx(auVar26,auVar26,1);
      auVar26 = vminps_avx(auVar32,auVar26);
      auVar26 = vcmpps_avx(auVar23,auVar26,0);
      auVar32 = local_1b8 & auVar26;
      auVar23 = vpcmpeqd_avx(auVar23,auVar23);
      if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar32[0xf] < '\0'
         ) {
        auVar23 = auVar26;
      }
      uVar15 = vextractps_avx(auVar49,1);
      auVar23 = vandps_avx(local_1b8,auVar23);
      uVar16 = vmovmskps_avx(auVar23);
      lVar20 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
LAB_0075f166:
      auVar49 = auVar50._0_16_;
      auVar26 = auVar47._0_16_;
      auVar23 = auVar45._0_16_;
      auVar44 = auVar53._0_16_;
      auVar33 = auVar52._0_16_;
      auVar24 = auVar54._0_16_;
      auVar32 = auVar51._0_16_;
      auVar34 = auVar56._0_16_;
      auVar28 = auVar55._0_16_;
      local_160 = *(uint *)(local_48 + lVar20 * 4);
      pRVar18 = (RTCIntersectArguments *)(ulong)local_160;
      pGVar10 = (pSVar9->geometries).items[(long)pRVar18].ptr;
      if ((pGVar10->mask & uVar15) == 0) {
        *(undefined4 *)(local_1b8 + lVar20 * 4) = 0;
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          (ray->super_RayK<1>).tfar = *(float *)(local_148 + lVar20 * 4);
          (ray->Ng).field_0.field_0.x = *(float *)(local_138 + lVar20 * 4);
          (ray->Ng).field_0.field_0.y = *(float *)(local_128 + lVar20 * 4);
          (ray->Ng).field_0.field_0.z = *(float *)(local_118 + lVar20 * 4);
          ray->u = 0.0;
          ray->v = 0.0;
          ray->primID = (sphere->primIDs).field_0.i[lVar20];
          ray->geomID = local_160;
          ray->instID[0] = context->user->instID[0];
          ray->instPrimID[0] = context->user->instPrimID[0];
          auVar7._0_4_ = (ray->super_RayK<1>).tfar;
          auVar7._4_4_ = (ray->super_RayK<1>).mask;
          auVar7._8_4_ = (ray->super_RayK<1>).id;
          auVar7._12_4_ = (ray->super_RayK<1>).flags;
          auVar41 = ZEXT1664(auVar7);
          uVar15 = vextractps_avx(auVar7,1);
LAB_0075f49b:
          auVar38 = vshufps_avx(auVar41._0_16_,auVar41._0_16_,0);
          local_148 = auVar43._0_16_;
          auVar38 = vcmpps_avx(local_148,auVar38,2);
          auVar28 = vandps_avx(auVar28,auVar38);
          auVar38 = auVar34 & auVar28;
          if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar38 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar38 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar38[0xf]) {
            return;
          }
          auVar28 = vandps_avx(auVar34,auVar28);
          fVar1 = auVar24._0_4_;
          auVar27._0_4_ = auVar32._0_4_ * fVar1;
          fVar2 = auVar24._4_4_;
          auVar27._4_4_ = auVar32._4_4_ * fVar2;
          fVar3 = auVar24._8_4_;
          auVar27._8_4_ = auVar32._8_4_ * fVar3;
          fVar4 = auVar24._12_4_;
          auVar27._12_4_ = auVar32._12_4_ * fVar4;
          auVar31._0_4_ = auVar33._0_4_ * fVar1;
          auVar31._4_4_ = auVar33._4_4_ * fVar2;
          auVar31._8_4_ = auVar33._8_4_ * fVar3;
          auVar31._12_4_ = auVar33._12_4_ * fVar4;
          auVar37._0_4_ = auVar44._0_4_ * fVar1;
          auVar37._4_4_ = auVar44._4_4_ * fVar2;
          auVar37._8_4_ = auVar44._8_4_ * fVar3;
          auVar37._12_4_ = auVar44._12_4_ * fVar4;
          local_138 = vsubps_avx(auVar27,auVar23);
          local_128 = vsubps_avx(auVar31,auVar26);
          local_118 = vsubps_avx(auVar37,auVar49);
          pSVar9 = context->scene;
          local_1b8 = auVar28;
          auVar23 = vblendvps_avx(auVar40._0_16_,local_148,auVar28);
          auVar26 = vshufps_avx(auVar23,auVar23,0xb1);
          auVar26 = vminps_avx(auVar26,auVar23);
          auVar49 = vshufpd_avx(auVar26,auVar26,1);
          auVar26 = vminps_avx(auVar49,auVar26);
          auVar23 = vcmpps_avx(auVar23,auVar26,0);
          auVar26 = auVar28 & auVar23;
          if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar26[0xf] < '\0') {
            auVar28 = vandps_avx(auVar23,auVar28);
          }
          uVar17 = vmovmskps_avx(auVar28);
          uVar19 = CONCAT44((int)((ulong)pRVar18 >> 0x20),uVar17);
          lVar20 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
            }
          }
          do {
            local_160 = *(uint *)(local_48 + lVar20 * 4);
            pRVar18 = (RTCIntersectArguments *)(ulong)local_160;
            pGVar10 = (pSVar9->geometries).items[(long)pRVar18].ptr;
            if ((pGVar10->mask & uVar15) == 0) {
              *(undefined4 *)(local_1b8 + lVar20 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = *(float *)(local_148 + lVar20 * 4);
                (ray->Ng).field_0.field_0.x = *(float *)(local_138 + lVar20 * 4);
                (ray->Ng).field_0.field_0.y = *(float *)(local_128 + lVar20 * 4);
                (ray->Ng).field_0.field_0.z = *(float *)(local_118 + lVar20 * 4);
                ray->u = 0.0;
                ray->v = 0.0;
                ray->primID = (sphere->primIDs).field_0.i[lVar20];
                ray->geomID = local_160;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                return;
              }
              local_f8 = auVar41._0_16_;
              local_108 = auVar43._0_16_;
              local_178 = *(float *)(local_138 + lVar20 * 4);
              local_174 = *(undefined4 *)(local_128 + lVar20 * 4);
              local_170 = *(undefined4 *)(local_118 + lVar20 * 4);
              local_16c = 0;
              local_164 = (sphere->primIDs).field_0.i[lVar20];
              pRVar18 = (RTCIntersectArguments *)0x0;
              local_15c = context->user->instID[0];
              local_158 = context->user->instPrimID[0];
              (ray->super_RayK<1>).tfar = *(float *)(local_148 + lVar20 * 4);
              local_1bc = -1;
              local_1a8.valid = &local_1bc;
              local_1a8.geometryUserPtr = pGVar10->userPtr;
              local_1a8.context = context->user;
              local_1a8.ray = (RTCRayN *)ray;
              local_1a8.hit = (RTCHitN *)&local_178;
              local_1a8.N = 1;
              if ((pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar10->intersectionFilterN)(&local_1a8), *local_1a8.valid != 0)) {
                pRVar18 = context->args;
                if ((pRVar18->filter != (RTCFilterFunctionN)0x0) &&
                   ((((pRVar18->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                      RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0))
                    && ((*pRVar18->filter)(&local_1a8), *local_1a8.valid == 0)))) goto LAB_0075f700;
                (((Vec3f *)((long)local_1a8.ray + 0x30))->field_0).field_0.x =
                     *(float *)local_1a8.hit;
                (((Vec3f *)((long)local_1a8.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_1a8.hit + 4);
                (((Vec3f *)((long)local_1a8.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_1a8.hit + 8);
                *(float *)((long)local_1a8.ray + 0x3c) = *(float *)(local_1a8.hit + 0xc);
                *(float *)((long)local_1a8.ray + 0x40) = *(float *)(local_1a8.hit + 0x10);
                *(float *)((long)local_1a8.ray + 0x44) = *(float *)(local_1a8.hit + 0x14);
                *(float *)((long)local_1a8.ray + 0x48) = *(float *)(local_1a8.hit + 0x18);
                *(float *)((long)local_1a8.ray + 0x4c) = *(float *)(local_1a8.hit + 0x1c);
                pRVar18 = (RTCIntersectArguments *)0x0;
                *(float *)((long)local_1a8.ray + 0x50) = *(float *)(local_1a8.hit + 0x20);
              }
              else {
LAB_0075f700:
                (ray->super_RayK<1>).tfar = (float)local_f8._0_4_;
              }
              auVar40 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              *(undefined4 *)(local_1b8 + lVar20 * 4) = 0;
              fVar1 = (ray->super_RayK<1>).tfar;
              auVar22._4_4_ = fVar1;
              auVar22._0_4_ = fVar1;
              auVar22._8_4_ = fVar1;
              auVar22._12_4_ = fVar1;
              auVar43 = ZEXT1664(local_108);
              auVar23 = vcmpps_avx(local_108,auVar22,2);
              local_1b8 = vandps_avx(auVar23,local_1b8);
              auVar8._0_4_ = (ray->super_RayK<1>).tfar;
              auVar8._4_4_ = (ray->super_RayK<1>).mask;
              auVar8._8_4_ = (ray->super_RayK<1>).id;
              auVar8._12_4_ = (ray->super_RayK<1>).flags;
              auVar41 = ZEXT1664(auVar8);
              uVar15 = vextractps_avx(auVar8,1);
            }
            if ((((local_1b8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_1b8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_1b8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_1b8[0xf]) {
              return;
            }
            auVar23 = vblendvps_avx(auVar40._0_16_,auVar43._0_16_,local_1b8);
            auVar26 = vshufps_avx(auVar23,auVar23,0xb1);
            auVar26 = vminps_avx(auVar26,auVar23);
            auVar49 = vshufpd_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar49,auVar26);
            auVar26 = vcmpps_avx(auVar23,auVar26,0);
            auVar49 = local_1b8 & auVar26;
            auVar23 = local_1b8;
            if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar49[0xf] < '\0') {
              auVar23 = vandps_avx(auVar26,local_1b8);
            }
            uVar17 = vmovmskps_avx(auVar23);
            uVar19 = CONCAT44((int)((ulong)pRVar18 >> 0x20),uVar17);
            lVar20 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
          } while( true );
        }
        local_e8 = auVar34;
        local_d8 = auVar28;
        local_c8 = auVar24;
        local_b8 = auVar49;
        local_a8 = auVar26;
        local_98 = auVar23;
        local_88 = auVar44;
        local_78 = auVar33;
        local_68 = auVar32;
        local_f8 = auVar41._0_16_;
        local_108 = auVar43._0_16_;
        local_178 = *(float *)(local_138 + lVar20 * 4);
        local_174 = *(undefined4 *)(local_128 + lVar20 * 4);
        local_170 = *(undefined4 *)(local_118 + lVar20 * 4);
        local_16c = 0;
        local_164 = (sphere->primIDs).field_0.i[lVar20];
        pRVar18 = (RTCIntersectArguments *)0x0;
        local_15c = context->user->instID[0];
        local_158 = context->user->instPrimID[0];
        (ray->super_RayK<1>).tfar = *(float *)(local_148 + lVar20 * 4);
        local_1bc = -1;
        local_1a8.valid = &local_1bc;
        local_1a8.geometryUserPtr = pGVar10->userPtr;
        local_1a8.context = context->user;
        local_1a8.ray = (RTCRayN *)ray;
        local_1a8.hit = (RTCHitN *)&local_178;
        local_1a8.N = 1;
        if ((pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
           ((*pGVar10->intersectionFilterN)(&local_1a8), *local_1a8.valid != 0)) {
          pRVar18 = context->args;
          if ((pRVar18->filter != (RTCFilterFunctionN)0x0) &&
             ((((pRVar18->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)) &&
              ((*pRVar18->filter)(&local_1a8), *local_1a8.valid == 0)))) goto LAB_0075f385;
          (((Vec3f *)((long)local_1a8.ray + 0x30))->field_0).field_0.x = *(float *)local_1a8.hit;
          (((Vec3f *)((long)local_1a8.ray + 0x30))->field_0).field_0.y =
               *(float *)(local_1a8.hit + 4);
          (((Vec3f *)((long)local_1a8.ray + 0x30))->field_0).field_0.z =
               *(float *)(local_1a8.hit + 8);
          *(float *)((long)local_1a8.ray + 0x3c) = *(float *)(local_1a8.hit + 0xc);
          *(float *)((long)local_1a8.ray + 0x40) = *(float *)(local_1a8.hit + 0x10);
          *(float *)((long)local_1a8.ray + 0x44) = *(float *)(local_1a8.hit + 0x14);
          *(float *)((long)local_1a8.ray + 0x48) = *(float *)(local_1a8.hit + 0x18);
          *(float *)((long)local_1a8.ray + 0x4c) = *(float *)(local_1a8.hit + 0x1c);
          pRVar18 = (RTCIntersectArguments *)0x0;
          *(float *)((long)local_1a8.ray + 0x50) = *(float *)(local_1a8.hit + 0x20);
        }
        else {
LAB_0075f385:
          (ray->super_RayK<1>).tfar = (float)local_f8._0_4_;
        }
        auVar43 = ZEXT1664(local_108);
        auVar40 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar51 = ZEXT1664(local_68);
        auVar52 = ZEXT1664(local_78);
        auVar53 = ZEXT1664(local_88);
        auVar45 = ZEXT1664(local_98);
        auVar47 = ZEXT1664(local_a8);
        auVar50 = ZEXT1664(local_b8);
        auVar54 = ZEXT1664(local_c8);
        auVar55 = ZEXT1664(local_d8);
        auVar56 = ZEXT1664(local_e8);
        *(undefined4 *)(local_1b8 + lVar20 * 4) = 0;
        fVar1 = (ray->super_RayK<1>).tfar;
        auVar21._4_4_ = fVar1;
        auVar21._0_4_ = fVar1;
        auVar21._8_4_ = fVar1;
        auVar21._12_4_ = fVar1;
        auVar23 = vcmpps_avx(local_58,auVar21,2);
        local_1b8 = vandps_avx(auVar23,local_1b8);
        auVar6._0_4_ = (ray->super_RayK<1>).tfar;
        auVar6._4_4_ = (ray->super_RayK<1>).mask;
        auVar6._8_4_ = (ray->super_RayK<1>).id;
        auVar6._12_4_ = (ray->super_RayK<1>).flags;
        auVar41 = ZEXT1664(auVar6);
        uVar15 = vextractps_avx(auVar6,1);
      }
      auVar49 = auVar50._0_16_;
      auVar26 = auVar47._0_16_;
      auVar23 = auVar45._0_16_;
      auVar44 = auVar53._0_16_;
      auVar33 = auVar52._0_16_;
      auVar24 = auVar54._0_16_;
      auVar32 = auVar51._0_16_;
      auVar34 = auVar56._0_16_;
      auVar28 = auVar55._0_16_;
      if ((((local_1b8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (local_1b8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (local_1b8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          -1 < local_1b8[0xf]) goto LAB_0075f49b;
      auVar23 = vblendvps_avx(auVar40._0_16_,local_58,local_1b8);
      auVar26 = vshufps_avx(auVar23,auVar23,0xb1);
      auVar26 = vminps_avx(auVar26,auVar23);
      auVar49 = vshufpd_avx(auVar26,auVar26,1);
      auVar26 = vminps_avx(auVar49,auVar26);
      auVar26 = vcmpps_avx(auVar23,auVar26,0);
      auVar49 = local_1b8 & auVar26;
      auVar23 = local_1b8;
      if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar49[0xf] < '\0'
         ) {
        auVar23 = vandps_avx(auVar26,local_1b8);
      }
      uVar17 = vmovmskps_avx(auVar23);
      uVar19 = CONCAT44((int)((ulong)pRVar18 >> 0x20),uVar17);
      lVar20 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      goto LAB_0075f166;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, sphere.geomID(), sphere.primID()));
      }